

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

void copy_rect(uint16_t *dst,int dstride,uint16_t *src,int sstride,int v,int h)

{
  int j;
  int i;
  int h_local;
  int v_local;
  int sstride_local;
  uint16_t *src_local;
  int dstride_local;
  uint16_t *dst_local;
  
  for (i = 0; i < v; i = i + 1) {
    for (j = 0; j < h; j = j + 1) {
      dst[i * dstride + j] = src[i * sstride + j];
    }
  }
  return;
}

Assistant:

static inline void copy_rect(uint8_t *dst, int dstride, const uint8_t *src,
                             int sstride, int width, int height, int use_hbd) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd) {
    aom_highbd_convolve_copy(CONVERT_TO_SHORTPTR(src), sstride,
                             CONVERT_TO_SHORTPTR(dst), dstride, width, height);
  } else {
    aom_convolve_copy(src, sstride, dst, dstride, width, height);
  }
#else
  (void)use_hbd;
  aom_convolve_copy(src, sstride, dst, dstride, width, height);
#endif
}